

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiKeyModFlags ImGui::GetMergedKeyModFlags(void)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = (GImGui->IO).KeyCtrl;
  uVar2 = bVar1 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar2 = (uint)bVar1;
  }
  uVar3 = uVar2 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar3 = uVar2;
  }
  uVar2 = uVar3 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

ImGuiKeyModFlags ImGui::GetMergedKeyModFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiKeyModFlags key_mod_flags = ImGuiKeyModFlags_None;
    if (g.IO.KeyCtrl)   { key_mod_flags |= ImGuiKeyModFlags_Ctrl; }
    if (g.IO.KeyShift)  { key_mod_flags |= ImGuiKeyModFlags_Shift; }
    if (g.IO.KeyAlt)    { key_mod_flags |= ImGuiKeyModFlags_Alt; }
    if (g.IO.KeySuper)  { key_mod_flags |= ImGuiKeyModFlags_Super; }
    return key_mod_flags;
}